

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O3

void QHttpThreadDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool _t4;
  code *pcVar1;
  long lVar2;
  QHttpHeaders *_t1;
  QString *_t3;
  QSharedPointer<char> _t5;
  undefined8 *puVar3;
  InterfaceType *pIVar4;
  int iVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  bool in_stack_ffffffffffffffa8;
  undefined8 local_50;
  Data *local_48;
  undefined8 local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
    case 0x1d:
    case 0x21:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
LAB_00211da6:
        *puVar3 = pIVar4;
        goto switchD_00211c2c_default;
      }
      break;
    case 1:
    case 0x22:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
        goto LAB_00211da6;
      }
      break;
    default:
      puVar3 = (undefined8 *)*_a;
      break;
    case 3:
    case 0x1f:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_00211da6;
      }
      break;
    case 4:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslConfiguration>::metaType;
        goto LAB_00211da6;
      }
      break;
    case 5:
    case 0x20:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00211da6;
      }
      break;
    case 0xb:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_00211da6;
      }
    }
    *puVar3 = 0;
    goto switchD_00211c2c_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == authenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == proxyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == encrypted && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == sslErrors && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == sslConfigurationChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == preSharedKeyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar1 == socketStartedConnecting && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar1 == requestSent && lVar2 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar1 == downloadMetaData && lVar2 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar1 == downloadProgress && lVar2 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (pcVar1 == downloadData && lVar2 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (pcVar1 == error && lVar2 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    else if (pcVar1 == downloadFinished && lVar2 == 0) {
      *(undefined4 *)*_a = 0xc;
    }
    else if (pcVar1 == redirected && lVar2 == 0) {
      *(undefined4 *)*_a = 0xd;
    }
    goto switchD_00211c2c_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_00211c2c_default;
  switch(_id) {
  case 0:
    local_38.d.ptr = (char16_t *)_a[1];
    local_40 = *_a[2];
    local_38.d.size = (qsizetype)&local_40;
    iVar5 = 0;
    goto LAB_002121ec;
  case 1:
    local_38.d.ptr = (char16_t *)_a[1];
    local_40 = *_a[2];
    local_38.d.size = (qsizetype)&local_40;
    iVar5 = 1;
    goto LAB_002121ec;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar5 = 2;
LAB_0021219a:
      QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)0x0);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sslErrors((QHttpThreadDelegate *)_o,(QList<QSslError> *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 4:
    local_38.d.ptr = (char16_t *)_a[1];
    iVar5 = 4;
    goto LAB_002121ec;
  case 5:
    local_40 = *_a[1];
    local_38.d.ptr = (char16_t *)&local_40;
    iVar5 = 5;
    goto LAB_002121ec;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar5 = 6;
      goto LAB_0021219a;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar5 = 7;
      goto LAB_0021219a;
    }
    break;
  case 8:
    _t1 = (QHttpHeaders *)_a[1];
    iVar5 = *_a[2];
    _t3 = (QString *)_a[3];
    _t4 = *_a[4];
    local_50 = *_a[5];
    local_48 = *(Data **)((long)_a[5] + 8);
    if (local_48 != (Data *)0x0) {
      LOCK();
      (local_48->weakref)._q_value.super___atomic_base<int>._M_i =
           (local_48->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (local_48->strongref)._q_value.super___atomic_base<int>._M_i =
           (local_48->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _t5.d = *_a[7];
    _t5.value.ptr = *_a[6];
    downloadMetaData((QHttpThreadDelegate *)_o,_t1,iVar5,_t3,_t4,_t5,(qint64)&local_50,(ulong)*_a[8]
                     ,*_a[9],in_stack_ffffffffffffffa8);
    QSharedPointer<char>::deref(local_48);
    goto switchD_00211c2c_default;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      downloadProgress((QHttpThreadDelegate *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 10:
    local_38.d.ptr = (char16_t *)_a[1];
    iVar5 = 10;
    goto LAB_002121ec;
  case 0xb:
    local_38.d.size = (qsizetype)_a[2];
    local_38.d.ptr = (char16_t *)&local_40;
    local_40 = CONCAT44(local_40._4_4_,*_a[1]);
    iVar5 = 0xb;
LAB_002121ec:
    local_38.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)&local_38);
switchD_00211c2c_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      iVar5 = 0xc;
      goto LAB_0021219a;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      redirected((QHttpThreadDelegate *)_o,(QUrl *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      startRequest((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      abortRequest((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      readBufferSizeChanged((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      readBufferFreed((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      startRequestSynchronously((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      readyReadSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      finishedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      finishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0x16:
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    finishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],&local_38);
    goto LAB_00212300;
  case 0x17:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousFinishedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x18:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousFinishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    break;
  case 0x19:
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    synchronousFinishedWithErrorSlot((QHttpThreadDelegate *)_o,*_a[1],&local_38);
LAB_00212300:
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto switchD_00211c2c_default;
  case 0x1a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      headerChangedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x1b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousHeaderChangedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x1c:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      dataReadProgressSlot((QHttpThreadDelegate *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      cacheCredentialsSlot((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)_a[1],*_a[2]);
      return;
    }
    break;
  case 0x1e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      encryptedSlot((QHttpThreadDelegate *)_o);
      return;
    }
    break;
  case 0x1f:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sslErrorsSlot((QHttpThreadDelegate *)_o,(QList<QSslError> *)_a[1]);
      return;
    }
    break;
  case 0x20:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      preSharedKeyAuthenticationRequiredSlot((QHttpThreadDelegate *)_o,*_a[1]);
      return;
    }
    break;
  case 0x21:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousAuthenticationRequiredSlot
                ((QHttpThreadDelegate *)_o,(QHttpNetworkRequest *)CONCAT44(in_register_00000034,_c),
                 *_a[2]);
      return;
    }
    break;
  case 0x22:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      synchronousProxyAuthenticationRequiredSlot
                ((QHttpThreadDelegate *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
    break;
  default:
    goto switchD_00211c2c_default;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpThreadDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->encrypted(); break;
        case 3: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool*>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>*>>(_a[3]))); break;
        case 4: _t->sslConfigurationChanged((*reinterpret_cast< std::add_pointer_t<QSslConfiguration>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->socketStartedConnecting(); break;
        case 7: _t->requestSent(); break;
        case 8: _t->downloadMetaData((*reinterpret_cast< std::add_pointer_t<QHttpHeaders>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QSharedPointer<char>>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[8])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[9]))); break;
        case 9: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 10: _t->downloadData((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1]))); break;
        case 11: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 12: _t->downloadFinished(); break;
        case 13: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->startRequest(); break;
        case 15: _t->abortRequest(); break;
        case 16: _t->readBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 17: _t->readBufferFreed((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 18: _t->startRequestSynchronously(); break;
        case 19: _t->readyReadSlot(); break;
        case 20: _t->finishedSlot(); break;
        case 21: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 22: _t->finishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 23: _t->synchronousFinishedSlot(); break;
        case 24: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 25: _t->synchronousFinishedWithErrorSlot((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 26: _t->headerChangedSlot(); break;
        case 27: _t->synchronousHeaderChangedSlot(); break;
        case 28: _t->dataReadProgressSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 29: _t->cacheCredentialsSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 30: _t->encryptedSlot(); break;
        case 31: _t->sslErrorsSlot((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 32: _t->preSharedKeyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 33: _t->synchronousAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 34: _t->synchronousProxyAuthenticationRequiredSlot((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslConfiguration >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 11:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 22:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 29:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 32:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 33:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 34:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpThreadDelegate::authenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpThreadDelegate::proxyAuthenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::encrypted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QList<QSslError> & , bool * , QList<QSslError> * )>(_a, &QHttpThreadDelegate::sslErrors, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QSslConfiguration & )>(_a, &QHttpThreadDelegate::sslConfigurationChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpThreadDelegate::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::socketStartedConnecting, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::requestSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QHttpHeaders & , int , const QString & , bool , QSharedPointer<char> , qint64 , qint64 , bool , bool )>(_a, &QHttpThreadDelegate::downloadMetaData, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(qint64 , qint64 )>(_a, &QHttpThreadDelegate::downloadProgress, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QByteArray & )>(_a, &QHttpThreadDelegate::downloadData, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpThreadDelegate::error, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)()>(_a, &QHttpThreadDelegate::downloadFinished, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpThreadDelegate::*)(const QUrl & , int , int )>(_a, &QHttpThreadDelegate::redirected, 13))
            return;
    }
}